

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void btreeEndTransaction(Btree *p)

{
  BtShared *pBt;
  BtLock *pBVar1;
  int iVar2;
  ushort uVar3;
  BtLock **ppBVar4;
  
  pBt = p->pBt;
  pBt->bDoTruncate = '\0';
  if (p->inTrans == '\0') goto LAB_0012b456;
  if (1 < p->db->activeVdbeCnt) {
    if (pBt->pWriter == p) {
      pBt->pWriter = (Btree *)0x0;
      *(byte *)&pBt->btsFlags = (byte)pBt->btsFlags & 0x9f;
      ppBVar4 = &pBt->pLock;
      while (pBVar1 = *ppBVar4, pBVar1 != (BtLock *)0x0) {
        pBVar1->eLock = '\x01';
        ppBVar4 = &pBVar1->pNext;
      }
    }
    p->inTrans = '\x01';
    return;
  }
  ppBVar4 = &pBt->pLock;
  while (pBVar1 = *ppBVar4, pBVar1 != (BtLock *)0x0) {
    if (pBVar1->pBtree == p) {
      *ppBVar4 = pBVar1->pNext;
      if (pBVar1->iTable != 1) {
        sqlite3_free(pBVar1);
      }
    }
    else {
      ppBVar4 = &pBVar1->pNext;
    }
  }
  if (pBt->pWriter == p) {
    pBt->pWriter = (Btree *)0x0;
    iVar2 = pBt->nTransaction;
    uVar3 = 0xff9f;
LAB_0012b444:
    pBt->btsFlags = pBt->btsFlags & uVar3;
  }
  else {
    iVar2 = pBt->nTransaction;
    if (iVar2 == 2) {
      uVar3 = 0xffbf;
      iVar2 = 2;
      goto LAB_0012b444;
    }
  }
  pBt->nTransaction = iVar2 + -1;
  if (iVar2 + -1 == 0) {
    pBt->inTransaction = '\0';
  }
LAB_0012b456:
  p->inTrans = '\0';
  unlockBtreeIfUnused(pBt);
  return;
}

Assistant:

static void btreeEndTransaction(Btree *p){
  BtShared *pBt = p->pBt;
  assert( sqlite3BtreeHoldsMutex(p) );

#ifndef SQLITE_OMIT_AUTOVACUUM
  pBt->bDoTruncate = 0;
#endif
  if( p->inTrans>TRANS_NONE && p->db->activeVdbeCnt>1 ){
    /* If there are other active statements that belong to this database
    ** handle, downgrade to a read-only transaction. The other statements
    ** may still be reading from the database.  */
    downgradeAllSharedCacheTableLocks(p);
    p->inTrans = TRANS_READ;
  }else{
    /* If the handle had any kind of transaction open, decrement the 
    ** transaction count of the shared btree. If the transaction count 
    ** reaches 0, set the shared state to TRANS_NONE. The unlockBtreeIfUnused()
    ** call below will unlock the pager.  */
    if( p->inTrans!=TRANS_NONE ){
      clearAllSharedCacheTableLocks(p);
      pBt->nTransaction--;
      if( 0==pBt->nTransaction ){
        pBt->inTransaction = TRANS_NONE;
      }
    }

    /* Set the current transaction state to TRANS_NONE and unlock the 
    ** pager if this call closed the only read or write transaction.  */
    p->inTrans = TRANS_NONE;
    unlockBtreeIfUnused(pBt);
  }

  btreeIntegrity(p);
}